

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(short lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  undefined2 in_SI;
  short in_DI;
  short unaff_retaddr;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> unaff_retaddr_00;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffe8;
  undefined6 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff6;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffffe;
  
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffffe);
  bVar1 = ModulusSimpleCaseHelper<short,_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::ModulusSimpleCase(unaff_retaddr,unaff_retaddr_00,
                              (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                               *)CONCAT26(in_stack_fffffffffffffffe.m_int,
                                          CONCAT24(in_SI,CONCAT22(in_DI,in_SI))));
  if (!bVar1) {
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xfffffffffffffff4,(short *)&stack0xfffffffffffffffa);
    SafeInt::operator_cast_to_short
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT26(in_stack_fffffffffffffff6,in_stack_fffffffffffffff0));
    in_stack_fffffffffffffffe =
         SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                   (in_stack_ffffffffffffffe8,0);
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         in_stack_fffffffffffffffe.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}